

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::WriteFirewirePhy(FpgaIO *this,uchar addr,uchar data)

{
  BasePort *pBVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  quadlet_t write_data;
  uchar data_local;
  uchar addr_local;
  FpgaIO *this_local;
  
  if (addr < 0x10) {
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,1,
                       (ulong)((uint)addr << 8 | 0x1000 | (uint)data));
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"WriteFirewirePhy: invalid addr ");
    this_01 = (void *)std::ostream::operator<<(this_00,(uint)addr);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::WriteFirewirePhy(unsigned char addr, unsigned char data)
{
    if (addr > 15) {
        std::cout << "WriteFirewirePhy: invalid addr "
                  << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    // Set bit 12 to indicate write; addr in bits 11-8, data in bits 7-0
    quadlet_t write_data = 0x00001000 | static_cast<quadlet_t>(addr) << 8 | static_cast<quadlet_t>(data);
    return port->WriteQuadlet(BoardId, BoardIO::FW_PHY_REQ, write_data);
}